

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curve.h
# Opt level: O3

Vector * __thiscall
anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>::point_at
          (Vector *__return_storage_ptr__,
          Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_> *this,double t)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  peVar1 = (this->m_curve_geometry).m_entry.
           super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar2 = (peVar1->m_data).
           super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (peVar1->m_data).
            super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  (*(peVar2->super_CurveBase<3L>)._vptr_CurveBase[5])(__return_storage_ptr__);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector point_at(const double t) const override
    {
        return m_curve_geometry->point_at(t);
    }